

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

int SimpleString::AtoI(char *str)

{
  char cVar1;
  bool bVar2;
  char *in_RDI;
  int result;
  char first_char;
  int local_14;
  int local_10;
  char *local_8;
  
  local_8 = in_RDI;
  while( true ) {
    bVar2 = isSpace(*local_8);
    if (!bVar2) break;
    local_8 = local_8 + 1;
  }
  cVar1 = *local_8;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    local_8 = local_8 + 1;
  }
  local_10 = 0;
  while( true ) {
    bVar2 = isDigit(*local_8);
    if (!bVar2) break;
    local_10 = *local_8 + -0x30 + local_10 * 10;
    local_8 = local_8 + 1;
  }
  if (cVar1 == '-') {
    local_14 = -local_10;
  }
  else {
    local_14 = local_10;
  }
  return local_14;
}

Assistant:

int SimpleString::AtoI(const char* str)
{
    while (isSpace(*str)) str++;

    char first_char = *str;
    if (first_char == '-' || first_char == '+') str++;

    int  result = 0;
    for(; isDigit(*str); str++)
    {
        result *= 10;
        result += *str - '0';
    }
    return (first_char == '-') ? -result : result;
}